

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O3

int ptls_openssl_lookup_certificate_add_identity
              (ptls_openssl_lookup_certificate_t *self,char *server_name,EVP_PKEY *key,
              stack_st_X509 *certs)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  st_ptls_openssl_identity_t *identity;
  uint8_t *puVar5;
  size_t sVar6;
  ec_key_st *key_00;
  EC_GROUP *group;
  X509 *a;
  st_ptls_openssl_identity_t **ppsVar7;
  size_t *psVar8;
  size_t sVar9;
  uchar *p;
  uint8_t *local_38;
  
  iVar1 = OPENSSL_sk_num(certs);
  identity = (st_ptls_openssl_identity_t *)malloc((long)iVar1 * 0x10 + 0x20);
  if (identity == (st_ptls_openssl_identity_t *)0x0) {
    return 0x201;
  }
  identity->num_certs = 0;
  identity->certs[0].base = (uint8_t *)0x0;
  (identity->name).len = 0;
  identity->key = (EVP_PKEY *)0x0;
  identity->certs[0].len = 0;
  puVar5 = (uint8_t *)strdup(server_name);
  (identity->name).base = puVar5;
  if (puVar5 == (uint8_t *)0x0) {
    iVar1 = 0x201;
    goto LAB_00104a7f;
  }
  sVar6 = strlen(server_name);
  (identity->name).len = sVar6;
  EVP_PKEY_up_ref(key);
  identity->key = key;
  iVar2 = EVP_PKEY_get_id(key);
  if (iVar2 != 6) {
    iVar1 = 0x204;
    if ((iVar2 != 0x198) ||
       (key_00 = EVP_PKEY_get1_EC_KEY((EVP_PKEY *)key), key_00 == (ec_key_st *)0x0))
    goto LAB_00104a7f;
    group = EC_KEY_get0_group(key_00);
    iVar2 = EC_GROUP_get_curve_name(group);
    EC_KEY_free(key_00);
    if (iVar2 != 0x19f) goto LAB_00104a7f;
  }
  iVar2 = OPENSSL_sk_num(certs);
  identity->num_certs = (long)iVar2;
  if (iVar2 != 0) {
    psVar8 = &identity->certs[0].len;
    sVar9 = 0;
    iVar1 = 0x203;
    do {
      a = (X509 *)OPENSSL_sk_value(certs);
      uVar3 = i2d_X509(a,(uchar **)0x0);
      if ((int)uVar3 < 1) goto LAB_00104a7f;
      puVar5 = (uint8_t *)malloc((ulong)uVar3);
      ((ptls_iovec_t *)(psVar8 + -1))->base = puVar5;
      if (puVar5 == (uint8_t *)0x0) {
        iVar1 = 0x201;
        goto LAB_00104a7f;
      }
      local_38 = puVar5;
      uVar4 = i2d_X509(a,&local_38);
      if (uVar4 != uVar3) goto LAB_00104a7f;
      *psVar8 = (ulong)uVar3;
      sVar9 = sVar9 + 1;
      psVar8 = psVar8 + 2;
    } while ((long)iVar2 != sVar9);
  }
  ppsVar7 = (st_ptls_openssl_identity_t **)realloc(self->identities,self->count * 8 + 8);
  iVar1 = 0x201;
  if (ppsVar7 != (st_ptls_openssl_identity_t **)0x0) {
    self->identities = ppsVar7;
    sVar9 = self->count;
    self->count = sVar9 + 1;
    ppsVar7[sVar9] = identity;
    return 0;
  }
LAB_00104a7f:
  free_identity(identity);
  return iVar1;
}

Assistant:

int ptls_openssl_lookup_certificate_add_identity(ptls_openssl_lookup_certificate_t *self, const char *server_name, EVP_PKEY *key,
                                                 STACK_OF(X509) * certs)
{
    struct st_ptls_openssl_identity_t *slot, **new_identities;
    size_t i;
    int ret;

    if ((slot = malloc(offsetof(struct st_ptls_openssl_identity_t, certs) + sizeof(slot->certs[0]) * sk_X509_num(certs))) == NULL) {
        ret = PTLS_ERROR_NO_MEMORY;
        goto Error;
    }

    *slot = (struct st_ptls_openssl_identity_t){{NULL}};
    if ((slot->name.base = (uint8_t *)strdup(server_name)) == NULL) {
        ret = PTLS_ERROR_NO_MEMORY;
        goto Error;
    }
    slot->name.len = strlen(server_name);

    EVP_PKEY_up_ref(key);
    slot->key = key;
    switch (EVP_PKEY_id(key)) {
    case EVP_PKEY_RSA:
        break;
    case EVP_PKEY_EC:
        if (!eckey_is_on_group(key, NID_X9_62_prime256v1)) {
            ret = PTLS_ERROR_INCOMPATIBLE_KEY;
            goto Error;
        }
        break;
    default:
        ret = PTLS_ERROR_INCOMPATIBLE_KEY;
        goto Error;
    }

    slot->num_certs = sk_X509_num(certs);
    for (i = 0; i != slot->num_certs; ++i) {
        X509 *cert = sk_X509_value(certs, (int)i);
        int len = i2d_X509(cert, NULL);
        if (len <= 0) {
            ret = PTLS_ERROR_LIBRARY;
            goto Error;
        }
        if ((slot->certs[i].base = malloc(len)) == NULL) {
            ret = PTLS_ERROR_NO_MEMORY;
            goto Error;
        }
        unsigned char *p = slot->certs[i].base;
        if (i2d_X509(cert, &p) != len) {
            ret = PTLS_ERROR_LIBRARY;
            goto Error;
        }
        slot->certs[i].len = len;
    }

    if ((new_identities = realloc(self->identities, sizeof(self->identities[0]) * (self->count + 1))) == NULL) {
        ret = PTLS_ERROR_NO_MEMORY;
        goto Error;
    }
    self->identities = new_identities;
    self->identities[self->count++] = slot;

    return 0;

Error:
    if (slot != NULL)
        free_identity(slot);
    return ret;
}